

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMPrint.cpp
# Opt level: O1

int main(int argC,char **argV)

{
  char cVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  size_t sVar5;
  XercesDOMParser *this;
  long *plVar6;
  long *plVar7;
  long *plVar8;
  DOMPrintFilter *this_00;
  long *plVar9;
  long *plVar10;
  LocalFileFormatTarget *this_01;
  undefined8 uVar11;
  long *plVar12;
  long lVar13;
  long lVar14;
  char *__s;
  char *pcVar15;
  undefined8 *puVar16;
  bool bVar17;
  int iVar18;
  MemoryManager *pMVar19;
  ulong uVar20;
  ulong uVar21;
  XMLCh tempStr [3];
  XMLCh *xpathStr;
  wchar16 local_1040 [4];
  wchar16 *local_1038 [513];
  
  __s = (char *)0x0;
  xercesc_4_0::XMLPlatformUtils::Initialize
            ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
             (MemoryManager *)0x0);
  if (1 < argC) {
    iVar18 = 0;
    uVar20 = 1;
    do {
      pcVar15 = argV[uVar20];
      uVar21 = uVar20;
      if (*pcVar15 != '-') break;
      iVar2 = strcmp(pcVar15,"-?");
      if (iVar2 == 0) {
        usage();
        xercesc_4_0::XMLPlatformUtils::Terminate();
        return 2;
      }
      iVar2 = strncmp(pcVar15,"-v=",3);
      if ((iVar2 == 0) || (iVar2 = strncmp(pcVar15,"-V=",3), iVar2 == 0)) {
        pcVar15 = pcVar15 + 3;
        __s = "never";
        iVar2 = strcmp(pcVar15,"never");
        if (iVar2 == 0) {
          gValScheme = Val_Never;
LAB_0010383f:
          bVar17 = true;
        }
        else {
          __s = "auto";
          iVar2 = strcmp(pcVar15,"auto");
          if (iVar2 == 0) {
            gValScheme = Val_Auto;
            goto LAB_0010383f;
          }
          __s = "always";
          iVar2 = strcmp(pcVar15,"always");
          if (iVar2 == 0) {
            gValScheme = Val_Always;
            goto LAB_0010383f;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Unknown -v= value: ",0x13);
          sVar5 = strlen(pcVar15);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar15,sVar5);
          cVar1 = std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x40);
          __s = (char *)(ulong)(uint)(int)cVar1;
          std::ostream::put(-0x40);
          std::ostream::flush();
LAB_001037fc:
          xercesc_4_0::XMLPlatformUtils::Terminate();
          iVar18 = 2;
          bVar17 = false;
        }
        if (!bVar17) {
          return iVar18;
        }
      }
      else {
        __s = "-n";
        iVar2 = strcmp(pcVar15,"-n");
        if (iVar2 != 0) {
          __s = "-N";
          iVar2 = strcmp(pcVar15,"-N");
          if (iVar2 != 0) {
            __s = "-s";
            iVar2 = strcmp(pcVar15,"-s");
            if (iVar2 == 0) {
LAB_0010382c:
              gDoSchema = 1;
            }
            else {
              __s = "-S";
              iVar2 = strcmp(pcVar15,"-S");
              if (iVar2 == 0) goto LAB_0010382c;
              __s = "-f";
              iVar2 = strcmp(pcVar15,"-f");
              if (iVar2 == 0) {
LAB_0010385a:
                gSchemaFullChecking = 1;
              }
              else {
                __s = "-F";
                iVar2 = strcmp(pcVar15,"-F");
                if (iVar2 == 0) goto LAB_0010385a;
                __s = "-e";
                iVar2 = strcmp(pcVar15,"-e");
                if (iVar2 == 0) {
LAB_00103863:
                  gDoCreate = (XercesDOMParser)0x1;
                }
                else {
                  __s = "-E";
                  iVar2 = strcmp(pcVar15,"-E");
                  if (iVar2 == 0) goto LAB_00103863;
                  iVar2 = strncmp(pcVar15,"-wenc=",6);
                  if (iVar2 == 0) {
                    __s = (char *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager;
                    gOutputEncoding =
                         (XMLCh *)xercesc_4_0::XMLString::transcode
                                            (pcVar15 + 6,
                                             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
                  }
                  else {
                    __s = "-wfile=";
                    iVar2 = strncmp(pcVar15,"-wfile=",7);
                    if (iVar2 != 0) {
                      iVar2 = strncmp(pcVar15,"-wddc=",6);
                      if (iVar2 == 0) {
                        pMVar19 = (MemoryManager *)(pcVar15 + 6);
                        __s = "on";
                        iVar2 = strcmp((char *)pMVar19,"on");
                        if (iVar2 != 0) {
                          __s = "off";
                          iVar3 = strcmp((char *)pMVar19,"off");
                          if (iVar3 != 0) {
                            lVar13 = 0x16;
                            pcVar15 = "Unknown -wddc= value: ";
                            __s = (char *)pMVar19;
LAB_00103aae:
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cerr,pcVar15,lVar13);
                            sVar5 = strlen(__s);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cerr,__s,sVar5);
                            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
                            goto LAB_001037fc;
                          }
                        }
                        gDiscardDefaultContent = iVar2 != 0;
                      }
                      else {
                        iVar2 = strncmp(pcVar15,"-wscs=",6);
                        if (iVar2 != 0) {
                          iVar2 = strncmp(pcVar15,"-wflt=",6);
                          if (iVar2 != 0) {
                            iVar2 = strncmp(pcVar15,"-wfpp=",6);
                            if (iVar2 != 0) {
                              iVar2 = strncmp(pcVar15,"-wfdecl=",8);
                              if (iVar2 != 0) {
                                iVar2 = strncmp(pcVar15,"-wbom=",6);
                                if (iVar2 != 0) {
                                  __s = "-xpath=";
                                  iVar2 = strncmp(pcVar15,"-xpath=",7);
                                  if (iVar2 == 0) {
                                    gXPathExpression = pcVar15 + 7;
                                  }
                                  else {
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cerr,"Unknown option \'",0x10);
                                    poVar4 = std::operator<<((ostream *)&std::cerr,argV[uVar20]);
                                    __s = "\', ignoring it.\n";
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar4,"\', ignoring it.\n",0x10);
                                    std::endl<char,std::char_traits<char>>(poVar4);
                                  }
                                  goto LAB_00103849;
                                }
                                pMVar19 = (MemoryManager *)(pcVar15 + 6);
                                __s = "on";
                                iVar2 = strcmp((char *)pMVar19,"on");
                                if (iVar2 != 0) {
                                  __s = "off";
                                  iVar3 = strcmp((char *)pMVar19,"off");
                                  if (iVar3 != 0) {
                                    lVar13 = 0x16;
                                    pcVar15 = "Unknown -wbom= value: ";
                                    __s = (char *)pMVar19;
                                    goto LAB_00103aae;
                                  }
                                }
                                gWriteBOM = iVar2 == 0;
                                goto LAB_0010383f;
                              }
                              pMVar19 = (MemoryManager *)(pcVar15 + 8);
                              __s = "on";
                              iVar2 = strcmp((char *)pMVar19,"on");
                              if (iVar2 != 0) {
                                __s = "off";
                                iVar3 = strcmp((char *)pMVar19,"off");
                                if (iVar3 != 0) {
                                  lVar13 = 0x18;
                                  pcVar15 = "Unknown -wfdecl= value: ";
                                  __s = (char *)pMVar19;
                                  goto LAB_00103aae;
                                }
                              }
                              gXMLDeclaration = iVar2 != 0;
                              goto LAB_0010383f;
                            }
                            pMVar19 = (MemoryManager *)(pcVar15 + 6);
                            __s = "on";
                            iVar2 = strcmp((char *)pMVar19,"on");
                            if (iVar2 != 0) {
                              __s = "off";
                              iVar3 = strcmp((char *)pMVar19,"off");
                              if (iVar3 != 0) {
                                lVar13 = 0x16;
                                pcVar15 = "Unknown -wfpp= value: ";
                                __s = (char *)pMVar19;
                                goto LAB_00103aae;
                              }
                            }
                            gFormatPrettyPrint = iVar2 == 0;
                            goto LAB_0010383f;
                          }
                          pMVar19 = (MemoryManager *)(pcVar15 + 6);
                          __s = "on";
                          iVar2 = strcmp((char *)pMVar19,"on");
                          if (iVar2 != 0) {
                            __s = "off";
                            iVar3 = strcmp((char *)pMVar19,"off");
                            if (iVar3 != 0) {
                              lVar13 = 0x16;
                              pcVar15 = "Unknown -wflt= value: ";
                              __s = (char *)pMVar19;
                              goto LAB_00103aae;
                            }
                          }
                          gUseFilter = iVar2 == 0;
                          goto LAB_0010383f;
                        }
                        pMVar19 = (MemoryManager *)(pcVar15 + 6);
                        __s = "on";
                        iVar2 = strcmp((char *)pMVar19,"on");
                        if (iVar2 != 0) {
                          __s = "off";
                          iVar3 = strcmp((char *)pMVar19,"off");
                          if (iVar3 != 0) {
                            lVar13 = 0x16;
                            pcVar15 = "Unknown -wscs= value: ";
                            __s = (char *)pMVar19;
                            goto LAB_00103aae;
                          }
                        }
                        gSplitCdataSections = iVar2 != 0;
                      }
                      goto LAB_0010383f;
                    }
                    goutputfile = pcVar15 + 7;
                  }
                }
              }
            }
            goto LAB_00103849;
          }
        }
        gDoNamespaces = 1;
      }
LAB_00103849:
      uVar20 = uVar20 + 1;
      uVar21 = (ulong)(uint)argC;
    } while ((uint)argC != uVar20);
    if ((int)uVar21 + 1 == argC) {
      this = (XercesDOMParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0xd8,(ulong)__s);
      xercesc_4_0::XercesDOMParser::XercesDOMParser
                (this,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
                 (XMLGrammarPool *)0x0);
      xercesc_4_0::AbstractDOMParser::setValidationScheme((ValSchemes)this);
      bVar17 = SUB81(this,0);
      xercesc_4_0::AbstractDOMParser::setDoNamespaces(bVar17);
      xercesc_4_0::AbstractDOMParser::setDoSchema(bVar17);
      xercesc_4_0::AbstractDOMParser::setHandleMultipleImports(bVar17);
      xercesc_4_0::AbstractDOMParser::setValidationSchemaFullChecking(bVar17);
      this[0x28] = gDoCreate;
      plVar6 = (long *)operator_new(0x10);
      *plVar6 = (long)&PTR__ErrorHandler_00107cf8;
      *(undefined1 *)(plVar6 + 1) = 0;
      xercesc_4_0::XercesDOMParser::setErrorHandler((ErrorHandler *)this);
      xercesc_4_0::AbstractDOMParser::parse((char *)this);
      iVar18 = 4;
      if ((char)plVar6[1] == '\0') {
        local_1040[2] = 0;
        local_1040[0] = L'L';
        local_1040[1] = L'S';
        plVar7 = (long *)xercesc_4_0::DOMImplementationRegistry::getDOMImplementation(local_1040);
        plVar8 = (long *)(**(code **)(*plVar7 + 0x18))
                                   (plVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        plVar7 = (long *)(**(code **)(*plVar7 + 0x28))
                                   (plVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        (**(code **)(*plVar7 + 0x30))(plVar7,gOutputEncoding);
        if (gUseFilter == 1) {
          this_00 = (DOMPrintFilter *)operator_new(0x10);
          DOMPrintFilter::DOMPrintFilter(this_00,0x203);
          (**(code **)(*plVar8 + 0x20))(plVar8,this_00);
        }
        else {
          this_00 = (DOMPrintFilter *)0x0;
        }
        plVar9 = (long *)operator_new(8);
        *plVar9 = (long)&PTR__DOMErrorHandler_00107c38;
        plVar10 = (long *)(**(code **)(*plVar8 + 0x10))(plVar8);
        (**(code **)*plVar10)(plVar10,&xercesc_4_0::XMLUni::fgDOMErrorHandler,plVar9);
        cVar1 = (**(code **)(*plVar10 + 0x20))
                          (plVar10,&xercesc_4_0::XMLUni::fgDOMWRTSplitCdataSections,
                           gSplitCdataSections ^ 1);
        if (cVar1 != '\0') {
          (**(code **)(*plVar10 + 8))
                    (plVar10,&xercesc_4_0::XMLUni::fgDOMWRTSplitCdataSections,
                     gSplitCdataSections ^ 1);
        }
        cVar1 = (**(code **)(*plVar10 + 0x20))
                          (plVar10,&xercesc_4_0::XMLUni::fgDOMWRTDiscardDefaultContent,
                           gDiscardDefaultContent ^ 1);
        if (cVar1 != '\0') {
          (**(code **)(*plVar10 + 8))
                    (plVar10,&xercesc_4_0::XMLUni::fgDOMWRTDiscardDefaultContent,
                     gDiscardDefaultContent ^ 1);
        }
        cVar1 = (**(code **)(*plVar10 + 0x20))
                          (plVar10,&xercesc_4_0::XMLUni::fgDOMWRTFormatPrettyPrint,
                           gFormatPrettyPrint);
        if (cVar1 != '\0') {
          (**(code **)(*plVar10 + 8))
                    (plVar10,&xercesc_4_0::XMLUni::fgDOMWRTFormatPrettyPrint,gFormatPrettyPrint);
        }
        cVar1 = (**(code **)(*plVar10 + 0x20))(plVar10,&xercesc_4_0::XMLUni::fgDOMWRTBOM,gWriteBOM);
        if (cVar1 != '\0') {
          (**(code **)(*plVar10 + 8))(plVar10,&xercesc_4_0::XMLUni::fgDOMWRTBOM,gWriteBOM);
        }
        puVar16 = &xercesc_4_0::XMLUni::fgDOMXMLDeclaration;
        cVar1 = (**(code **)(*plVar10 + 0x20))
                          (plVar10,&xercesc_4_0::XMLUni::fgDOMXMLDeclaration,gXMLDeclaration ^ 1);
        if (cVar1 != '\0') {
          puVar16 = &xercesc_4_0::XMLUni::fgDOMXMLDeclaration;
          (**(code **)(*plVar10 + 8))
                    (plVar10,&xercesc_4_0::XMLUni::fgDOMXMLDeclaration,gXMLDeclaration ^ 1);
        }
        if (goutputfile == (char *)0x0) {
          this_01 = (LocalFileFormatTarget *)
                    xercesc_4_0::XMemory::operator_new((XMemory *)0x8,(ulong)puVar16);
          xercesc_4_0::StdOutFormatTarget::StdOutFormatTarget((StdOutFormatTarget *)this_01);
        }
        else {
          this_01 = (LocalFileFormatTarget *)
                    xercesc_4_0::XMemory::operator_new((XMemory *)0x30,(ulong)puVar16);
          xercesc_4_0::LocalFileFormatTarget::LocalFileFormatTarget
                    (this_01,goutputfile,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        }
        (**(code **)(*plVar7 + 0x28))(plVar7,this_01);
        plVar10 = (long *)xercesc_4_0::AbstractDOMParser::getDocument();
        if (gXPathExpression == (char *)0x0) {
          plVar12 = plVar10 + 3;
          if (plVar10 == (long *)0x0) {
            plVar12 = (long *)0x0;
          }
          (**(code **)(*plVar8 + 0x38))(plVar8,plVar12,plVar7);
        }
        else {
          local_1038[0] =
               (wchar16 *)
               xercesc_4_0::XMLString::transcode
                         (gXPathExpression,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
          uVar11 = (**(code **)(*plVar10 + 0x68))(plVar10);
          plVar12 = plVar10 + 1;
          plVar10 = (long *)(**(code **)(plVar10[1] + 0x18))(plVar12,uVar11);
          plVar12 = (long *)(**(code **)(*plVar12 + 0x20))(plVar12,local_1038[0],uVar11,plVar10,7,0)
          ;
          lVar13 = (**(code **)(*plVar12 + 0x68))(plVar12);
          if (lVar13 != 0) {
            lVar14 = 0;
            do {
              (**(code **)(*plVar12 + 0x60))(plVar12,lVar14);
              uVar11 = (**(code **)(*plVar12 + 0x48))(plVar12);
              (**(code **)(*plVar8 + 0x38))(plVar8,uVar11,plVar7);
              lVar14 = lVar14 + 1;
            } while (lVar13 != lVar14);
          }
          (**(code **)(*plVar12 + 0x70))(plVar12);
          (**(code **)(*plVar10 + 0x28))(plVar10);
          xercesc_4_0::XMLString::release(local_1038,xercesc_4_0::XMLPlatformUtils::fgMemoryManager)
          ;
        }
        iVar18 = 0;
        (**(code **)(*plVar7 + 0x40))(plVar7);
        (**(code **)(*plVar8 + 0x50))(plVar8);
        (**(code **)(*(long *)this_01 + 8))();
        (**(code **)(*plVar9 + 8))();
        if ((this_00 != (DOMPrintFilter *)0x0) && ((gUseFilter & 1) != 0)) {
          (*(this_00->super_DOMLSSerializerFilter).super_DOMNodeFilter._vptr_DOMNodeFilter[1])();
        }
      }
      (**(code **)(*plVar6 + 8))();
      (**(code **)(*(long *)this + 8))(this);
      xercesc_4_0::XMLString::release
                (&gOutputEncoding,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      xercesc_4_0::XMLPlatformUtils::Terminate();
      return iVar18;
    }
  }
  usage();
  xercesc_4_0::XMLPlatformUtils::Terminate();
  return 1;
}

Assistant:

int main(int argC, char* argV[])
{
    int retval = 0;

    // Initialize the XML4C2 system
    try
    {
        XMLPlatformUtils::Initialize();
    }

    catch(const XMLException &toCatch)
    {
        std::cerr << "Error during Xerces-c Initialization.\n"
             << "  Exception message:"
             << StrX(toCatch.getMessage()) << std::endl;
        return 1;
    }

    // Check command line and extract arguments.
    if (argC < 2)
    {
        usage();
        XMLPlatformUtils::Terminate();
        return 1;
    }

    // See if non validating dom parser configuration is requested.
    int parmInd;
    for (parmInd = 1; parmInd < argC; parmInd++)
    {
        // Break out on first parm not starting with a dash
        if (argV[parmInd][0] != '-')
            break;

        // Watch for special case help request
        if (!strcmp(argV[parmInd], "-?"))
        {
            usage();
            XMLPlatformUtils::Terminate();
            return 2;
        }
         else if (!strncmp(argV[parmInd], "-v=", 3)
              ||  !strncmp(argV[parmInd], "-V=", 3))
        {
            const char* const parm = &argV[parmInd][3];

            if (!strcmp(parm, "never"))
                gValScheme = XercesDOMParser::Val_Never;
            else if (!strcmp(parm, "auto"))
                gValScheme = XercesDOMParser::Val_Auto;
            else if (!strcmp(parm, "always"))
                gValScheme = XercesDOMParser::Val_Always;
            else
            {
                std::cerr << "Unknown -v= value: " << parm << std::endl;
                XMLPlatformUtils::Terminate();
                return 2;
            }
        }
         else if (!strcmp(argV[parmInd], "-n")
              ||  !strcmp(argV[parmInd], "-N"))
        {
            gDoNamespaces = true;
        }
         else if (!strcmp(argV[parmInd], "-s")
              ||  !strcmp(argV[parmInd], "-S"))
        {
            gDoSchema = true;
        }
         else if (!strcmp(argV[parmInd], "-f")
              ||  !strcmp(argV[parmInd], "-F"))
        {
            gSchemaFullChecking = true;
        }
         else if (!strcmp(argV[parmInd], "-e")
              ||  !strcmp(argV[parmInd], "-E"))
        {
            gDoCreate = true;
        }
         else if (!strncmp(argV[parmInd], "-wenc=", 6))
        {
             // Get out the encoding name
             gOutputEncoding = XMLString::transcode( &(argV[parmInd][6]) );
        }
         else if (!strncmp(argV[parmInd], "-wfile=", 7))
        {
             goutputfile =  &(argV[parmInd][7]);
        }
         else if (!strncmp(argV[parmInd], "-wddc=", 6))
        {
            const char* const parm = &argV[parmInd][6];

            if (!strcmp(parm, "on"))
				gDiscardDefaultContent = true;
            else if (!strcmp(parm, "off"))
				gDiscardDefaultContent = false;
            else
            {
                std::cerr << "Unknown -wddc= value: " << parm << std::endl;
                XMLPlatformUtils::Terminate();
                return 2;
            }

        }
         else if (!strncmp(argV[parmInd], "-wscs=", 6))
        {
            const char* const parm = &argV[parmInd][6];

            if (!strcmp(parm, "on"))
				gSplitCdataSections = true;
			else if (!strcmp(parm, "off"))
				gSplitCdataSections = false;
            else
            {
                std::cerr << "Unknown -wscs= value: " << parm << std::endl;
                XMLPlatformUtils::Terminate();
                return 2;
            }
        }
         else if (!strncmp(argV[parmInd], "-wflt=", 6))
        {
            const char* const parm = &argV[parmInd][6];

            if (!strcmp(parm, "on"))
				gUseFilter = true;
			else if (!strcmp(parm, "off"))
				gUseFilter = false;
            else
            {
                std::cerr << "Unknown -wflt= value: " << parm << std::endl;
                XMLPlatformUtils::Terminate();
                return 2;
            }
        }
         else if (!strncmp(argV[parmInd], "-wfpp=", 6))
        {
            const char* const parm = &argV[parmInd][6];

            if (!strcmp(parm, "on"))
				gFormatPrettyPrint = true;
			else if (!strcmp(parm, "off"))
				gFormatPrettyPrint = false;
            else
            {
                std::cerr << "Unknown -wfpp= value: " << parm << std::endl;
                XMLPlatformUtils::Terminate();
                return 2;
            }
        }
         else if (!strncmp(argV[parmInd], "-wfdecl=", 8))
        {
             const char* const parm = &argV[parmInd][8];

             if (!strcmp(parm, "on"))
                 gXMLDeclaration = true;
             else if (!strcmp(parm, "off"))
                 gXMLDeclaration = false;
             else
             {
                 std::cerr << "Unknown -wfdecl= value: " << parm << std::endl;
                 XMLPlatformUtils::Terminate();
                 return 2;
             }
        }
         else if (!strncmp(argV[parmInd], "-wbom=", 6))
        {
            const char* const parm = &argV[parmInd][6];

            if (!strcmp(parm, "on"))
                gWriteBOM = true;
            else if (!strcmp(parm, "off"))
                gWriteBOM = false;
            else
            {
                std::cerr << "Unknown -wbom= value: " << parm << std::endl;
                XMLPlatformUtils::Terminate();
                return 2;
            }
        }
         else if (!strncmp(argV[parmInd], "-xpath=", 7))
        {
             gXPathExpression = &(argV[parmInd][7]);
        }
         else
        {
            std::cerr << "Unknown option '" << argV[parmInd]
                 << "', ignoring it.\n" << std::endl;
        }
    }

    //
    //  And now we have to have only one parameter left and it must be
    //  the file name.
    //
    if (parmInd + 1 != argC)
    {
        usage();
        XMLPlatformUtils::Terminate();
        return 1;
    }
    gXmlFile = argV[parmInd];

    //
    //  Create our parser, then attach an error handler to the parser.
    //  The parser will call back to methods of the ErrorHandler if it
    //  discovers errors during the course of parsing the XML document.
    //
    XercesDOMParser *parser = new XercesDOMParser;
    parser->setValidationScheme(gValScheme);
    parser->setDoNamespaces(gDoNamespaces);
    parser->setDoSchema(gDoSchema);
    parser->setHandleMultipleImports (true);
    parser->setValidationSchemaFullChecking(gSchemaFullChecking);
    parser->setCreateEntityReferenceNodes(gDoCreate);

    DOMTreeErrorReporter *errReporter = new DOMTreeErrorReporter();
    parser->setErrorHandler(errReporter);

    //
    //  Parse the XML file, catching any XML exceptions that might propogate
    //  out of it.
    //
    bool errorsOccured = false;
    try
    {
        parser->parse(gXmlFile);
    }
    catch (const OutOfMemoryException&)
    {
        std::cerr << "OutOfMemoryException" << std::endl;
        errorsOccured = true;
    }
    catch (const XMLException& e)
    {
        std::cerr << "An error occurred during parsing\n   Message: "
             << StrX(e.getMessage()) << std::endl;
        errorsOccured = true;
    }

    catch (const DOMException& e)
    {
        const unsigned int maxChars = 2047;
        XMLCh errText[maxChars + 1];

        std::cerr << "\nDOM Error during parsing: '" << gXmlFile << "'\n"
             << "DOMException code is:  " << e.code << std::endl;

        if (DOMImplementation::loadDOMExceptionMsg(e.code, errText, maxChars))
             std::cerr << "Message is: " << StrX(errText) << std::endl;

        errorsOccured = true;
    }

    catch (...)
    {
        std::cerr << "An error occurred during parsing\n " << std::endl;
        errorsOccured = true;
    }

    // If the parse was successful, output the document data from the DOM tree
    if (!errorsOccured && !errReporter->getSawErrors())
    {
        DOMPrintFilter   *myFilter = 0;

        try
        {
            // get a serializer, an instance of DOMLSSerializer
            XMLCh tempStr[3] = {chLatin_L, chLatin_S, chNull};
            DOMImplementation *impl          = DOMImplementationRegistry::getDOMImplementation(tempStr);
            DOMLSSerializer   *theSerializer = ((DOMImplementationLS*)impl)->createLSSerializer();
            DOMLSOutput       *theOutputDesc = ((DOMImplementationLS*)impl)->createLSOutput();

            // set user specified output encoding
            theOutputDesc->setEncoding(gOutputEncoding);

            // plug in user's own filter
            if (gUseFilter)
            {
                // even we say to show attribute, but the DOMLSSerializer
                // will not show attribute nodes to the filter as
                // the specs explicitly says that DOMLSSerializer shall
                // NOT show attributes to DOMLSSerializerFilter.
                //
                // so DOMNodeFilter::SHOW_ATTRIBUTE has no effect.
                // same DOMNodeFilter::SHOW_DOCUMENT_TYPE, no effect.
                //
                myFilter = new DOMPrintFilter(DOMNodeFilter::SHOW_ELEMENT   |
                                              DOMNodeFilter::SHOW_ATTRIBUTE |
                                              DOMNodeFilter::SHOW_DOCUMENT_TYPE);
                theSerializer->setFilter(myFilter);
            }

            // plug in user's own error handler
            DOMErrorHandler *myErrorHandler = new DOMPrintErrorHandler();
            DOMConfiguration* serializerConfig=theSerializer->getDomConfig();
            serializerConfig->setParameter(XMLUni::fgDOMErrorHandler, myErrorHandler);

            // set feature if the serializer supports the feature/mode
            if (serializerConfig->canSetParameter(XMLUni::fgDOMWRTSplitCdataSections, gSplitCdataSections))
                serializerConfig->setParameter(XMLUni::fgDOMWRTSplitCdataSections, gSplitCdataSections);

            if (serializerConfig->canSetParameter(XMLUni::fgDOMWRTDiscardDefaultContent, gDiscardDefaultContent))
                serializerConfig->setParameter(XMLUni::fgDOMWRTDiscardDefaultContent, gDiscardDefaultContent);

            if (serializerConfig->canSetParameter(XMLUni::fgDOMWRTFormatPrettyPrint, gFormatPrettyPrint))
                serializerConfig->setParameter(XMLUni::fgDOMWRTFormatPrettyPrint, gFormatPrettyPrint);

            if (serializerConfig->canSetParameter(XMLUni::fgDOMWRTBOM, gWriteBOM))
                serializerConfig->setParameter(XMLUni::fgDOMWRTBOM, gWriteBOM);
            
            if (serializerConfig->canSetParameter(XMLUni::fgDOMXMLDeclaration, gXMLDeclaration))
                serializerConfig->setParameter(XMLUni::fgDOMXMLDeclaration, gXMLDeclaration);

            //
            // Plug in a format target to receive the resultant
            // XML stream from the serializer.
            //
            // StdOutFormatTarget prints the resultant XML stream
            // to stdout once it receives any thing from the serializer.
            //
            XMLFormatTarget *myFormTarget;
            if (goutputfile)
                myFormTarget=new LocalFileFormatTarget(goutputfile);
            else
                myFormTarget=new StdOutFormatTarget();
            theOutputDesc->setByteStream(myFormTarget);

            // get the DOM representation
            DOMDocument *doc = parser->getDocument();

            //
            // do the serialization through DOMLSSerializer::write();
            //
            if(gXPathExpression!=NULL)
            {
                XMLCh* xpathStr=XMLString::transcode(gXPathExpression);
                DOMElement* root = doc->getDocumentElement();
                try
                {
                    DOMXPathNSResolver* resolver=doc->createNSResolver(root);
                    DOMXPathResult* result=doc->evaluate(
                      xpathStr,
                      root,
                      resolver,
                      DOMXPathResult::ORDERED_NODE_SNAPSHOT_TYPE,
                      NULL);

                    XMLSize_t nLength = result->getSnapshotLength();
                    for(XMLSize_t i = 0; i < nLength; i++)
                    {
                      result->snapshotItem(i);
                      theSerializer->write(result->getNodeValue(), theOutputDesc);
                    }

                    result->release();
                    resolver->release ();
                }
                catch(const DOMXPathException& e)
                {
                    std::cerr << "An error occurred during processing of the XPath expression. Msg is:"
                        << std::endl
                        << StrX(e.getMessage()) << std::endl;
                    retval = 4;
                }
                catch(const DOMException& e)
                {
                    std::cerr << "An error occurred during processing of the XPath expression. Msg is:"
                        << std::endl
                        << StrX(e.getMessage()) << std::endl;
                    retval = 4;
                }
                XMLString::release(&xpathStr);
            }
            else
                theSerializer->write(doc, theOutputDesc);

            theOutputDesc->release();
            theSerializer->release();

            //
            // Filter, formatTarget and error handler
            // are NOT owned by the serializer.
            //
            delete myFormTarget;
            delete myErrorHandler;

            if (gUseFilter)
                delete myFilter;

        }
        catch (const OutOfMemoryException&)
        {
            std::cerr << "OutOfMemoryException" << std::endl;
            retval = 5;
        }
        catch (const DOMLSException& e)
        {
            std::cerr << "An error occurred during serialization of the DOM tree. Msg is:"
                << std::endl
                << StrX(e.getMessage()) << std::endl;
            retval = 4;
        }
        catch (const XMLException& e)
        {
            std::cerr << "An error occurred during creation of output transcoder. Msg is:"
                << std::endl
                << StrX(e.getMessage()) << std::endl;
            retval = 4;
        }

    }
    else
        retval = 4;

    //
    //  Clean up the error handler. The parser does not adopt handlers
    //  since they could be many objects or one object installed for multiple
    //  handlers.
    //
    delete errReporter;

    //
    //  Delete the parser itself.  Must be done prior to calling Terminate, below.
    //
    delete parser;

    XMLString::release(&gOutputEncoding);

    // And call the termination method
    XMLPlatformUtils::Terminate();

    return retval;
}